

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O3

void __thiscall
burst::
difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
::difference_iterator
          (difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
           *this,_List_node_base *minuend_begin,_List_node_base *minuend_end,int *subtrahend_begin,
          int *subtrahend_end)

{
  _List_node_base *p_Var1;
  int *piVar2;
  _List_node_base *p_Var3;
  
  (this->m_minuend_begin)._M_node = minuend_begin;
  (this->m_minuend_end)._M_node = minuend_end;
  (this->m_subtrahend_begin)._M_current = subtrahend_begin;
  (this->m_subtrahend_end)._M_current = subtrahend_end;
  p_Var3 = minuend_begin;
  if (minuend_begin != minuend_end) {
    do {
      minuend_begin = p_Var3->_M_next;
      if (minuend_begin == minuend_end) goto LAB_0020230e;
      p_Var1 = p_Var3 + 1;
      p_Var3 = minuend_begin;
    } while (*(int *)&p_Var1->_M_next <= *(int *)&minuend_begin[1]._M_next);
  }
  if (minuend_begin != minuend_end) {
    __assert_fail("std::is_sorted(m_minuend_begin, m_minuend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6b,
                  "burst::difference_iterator<std::_List_const_iterator<int>, __gnu_cxx::__normal_iterator<const int *, std::vector<int>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<int>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, Compare = std::less<void>]"
                 );
  }
LAB_0020230e:
  if (subtrahend_begin != subtrahend_end) {
    piVar2 = subtrahend_begin + 1;
    do {
      subtrahend_begin = piVar2;
      if (subtrahend_begin == subtrahend_end) goto LAB_00202336;
      piVar2 = subtrahend_begin + 1;
    } while (subtrahend_begin[-1] <= *subtrahend_begin);
  }
  if (subtrahend_begin != subtrahend_end) {
    __assert_fail("std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6c,
                  "burst::difference_iterator<std::_List_const_iterator<int>, __gnu_cxx::__normal_iterator<const int *, std::vector<int>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<int>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, Compare = std::less<void>]"
                 );
  }
LAB_00202336:
  maintain_invariant(this);
  return;
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }